

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# electron_optimisation.cpp
# Opt level: O2

void __thiscall indigox::ElectronOpt::SortPotentialLocations(ElectronOpt *this)

{
  pointer ppVar1;
  undefined1 uVar2;
  char cVar3;
  MolVertPair *pMVar4;
  long lVar5;
  pointer ppVar6;
  void *pvVar7;
  pointer ppEVar8;
  StoredVertex *sv;
  ElnVertex pvVar9;
  pointer ppEVar10;
  uint uVar11;
  ulong uVar12;
  MolVertPair *vp;
  MolVertPair *pMVar13;
  ElnVertProp *p;
  undefined1 local_60 [24];
  vector<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_> sortedUniques;
  
  sortedUniques.super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sortedUniques.super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sortedUniques.super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>::reserve
            (&sortedUniques,
             (long)(this->possibleLocations_).
                   super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->possibleLocations_).
                   super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  pMVar13 = (this->possibleLocations_).
            super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pMVar4 = (this->possibleLocations_).
           super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    ppEVar8 = sortedUniques.
              super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppEVar10 = sortedUniques.
               super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (pMVar13 == pMVar4) {
      if (sortedUniques.
          super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          sortedUniques.
          super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        std::
        _Temporary_buffer<__gnu_cxx::__normal_iterator<indigox::ElnVertProp_**,_std::vector<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>_>,_indigox::ElnVertProp_*>
        ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<indigox::ElnVertProp_**,_std::vector<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>_>,_indigox::ElnVertProp_*>
                             *)local_60,
                            (__normal_iterator<indigox::ElnVertProp_**,_std::vector<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>_>
                             )sortedUniques.
                              super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                            (((long)sortedUniques.
                                    super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)sortedUniques.
                                    super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) + 1) / 2);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._16_8_ ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::
          __inplace_stable_sort<__gnu_cxx::__normal_iterator<indigox::ElnVertProp**,std::vector<indigox::ElnVertProp*,std::allocator<indigox::ElnVertProp*>>>,__gnu_cxx::__ops::_Iter_comp_iter<indigox::ElectronOpt::SortPotentialLocations()::__0>>
                    (ppEVar10,ppEVar8);
        }
        else {
          std::
          __stable_sort_adaptive<__gnu_cxx::__normal_iterator<indigox::ElnVertProp**,std::vector<indigox::ElnVertProp*,std::allocator<indigox::ElnVertProp*>>>,indigox::ElnVertProp**,long,__gnu_cxx::__ops::_Iter_comp_iter<indigox::ElectronOpt::SortPotentialLocations()::__0>>
                    (ppEVar10,ppEVar8,local_60._16_8_,local_60._8_8_);
        }
        std::
        _Temporary_buffer<__gnu_cxx::__normal_iterator<indigox::ElnVertProp_**,_std::vector<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>_>,_indigox::ElnVertProp_*>
        ::~_Temporary_buffer
                  ((_Temporary_buffer<__gnu_cxx::__normal_iterator<indigox::ElnVertProp_**,_std::vector<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>_>,_indigox::ElnVertProp_*>
                    *)local_60);
        ppEVar10 = sortedUniques.
                   super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      }
      ppVar6 = (this->possibleLocations_).
               super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (uVar11 = 0; uVar12 = (ulong)uVar11,
          uVar12 < (ulong)((long)ppEVar10 -
                           (long)sortedUniques.
                                 super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
          uVar11 = uVar11 + 1) {
        pvVar7 = (sortedUniques.
                  super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar12]->id).second;
        ppVar1 = ppVar6 + uVar12;
        ppVar1->first =
             (sortedUniques.
              super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar12]->id).first;
        ppVar1->second = pvVar7;
      }
      std::_Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>::
      ~_Vector_base(&sortedUniques.
                     super__Vector_base<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>
                   );
      return;
    }
    pvVar9 = ElectronGraph::GetVertex
                       ((this->elnGraph_).
                        super___shared_ptr<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,*pMVar13);
    p = (ElnVertProp *)((long)pvVar9 + 0x30);
    if (pMVar13->first == pMVar13->second) {
      Atom::GetElement((Atom *)local_60);
      cVar3 = *(char *)(local_60._0_8_ + 0x42);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
      switch(cVar3) {
      case '\a':
        lVar5 = *(long *)((long)pMVar13->first + 0x28);
        if (lVar5 == 3) {
          p->sort_score = N_THREE;
        }
        else if (lVar5 == 2) {
          p->sort_score = N_TWO;
        }
        else {
          if (lVar5 != 1) goto LAB_00112def;
          p->sort_score = N_ONE;
        }
        break;
      case '\b':
        lVar5 = *(long *)((long)pMVar13->first + 0x28);
        if (lVar5 == 2) {
          p->sort_score = O_TWO;
        }
        else {
          if (lVar5 != 1) goto LAB_00112def;
          p->sort_score = O_ONE;
        }
        break;
      case '\t':
        if (*(long *)((long)pMVar13->first + 0x28) == 1) {
          p->sort_score = F_ONE;
          break;
        }
        goto LAB_00112def;
      case '\n':
      case '\v':
      case '\f':
      case '\r':
      case '\x0e':
        goto switchD_0011288b_caseD_9;
      case '\x0f':
        lVar5 = *(long *)((long)pMVar13->first + 0x28);
        if (lVar5 == 3) {
          p->sort_score = P_THREE;
        }
        else if (lVar5 == 2) {
          p->sort_score = P_TWO;
        }
        else {
          if (lVar5 != 1) goto LAB_00112def;
          p->sort_score = P_ONE;
        }
        break;
      case '\x10':
        lVar5 = *(long *)((long)pMVar13->first + 0x28);
        if ((lVar5 != 2) && (lVar5 != 1)) goto LAB_00112def;
        p->sort_score = S_ONE;
        break;
      case '\x11':
        if (*(long *)((long)pMVar13->first + 0x28) != 1) goto LAB_00112def;
        p->sort_score = CL_ONE;
        break;
      default:
        if (cVar3 != '#') goto switchD_0011288b_caseD_9;
        if (*(long *)((long)pMVar13->first + 0x28) != 1) goto LAB_00112def;
        p->sort_score = BR_ONE;
      }
      goto LAB_00112df6;
    }
    Atom::GetElement((Atom *)local_60);
    uVar2 = *(undefined1 *)(local_60._0_8_ + 0x42);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
    switch(uVar2) {
    case 6:
      Atom::GetElement((Atom *)local_60);
      cVar3 = *(char *)(local_60._0_8_ + 0x42);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
      if (cVar3 != '\x06') {
        if (cVar3 == '\a') {
          lVar5 = *(long *)((long)pMVar13->first + 0x28);
          if (lVar5 == 3) {
            if (*(long *)((long)pMVar13->second + 0x28) == 2) goto LAB_00112dc5;
          }
          else if ((lVar5 == 2) && (*(long *)((long)pMVar13->second + 0x28) == 1))
          goto LAB_00112d0e;
        }
        else if (cVar3 == '\b') {
          if ((*(long *)((long)pMVar13->first + 0x28) == 3) &&
             (*(long *)((long)pMVar13->second + 0x28) == 1)) goto LAB_00112d3d;
        }
        else if (((cVar3 == '\x10') && (*(long *)((long)pMVar13->first + 0x28) == 3)) &&
                (*(long *)((long)pMVar13->second + 0x28) == 1)) goto LAB_00112bf4;
        goto switchD_0011288b_caseD_9;
      }
      lVar5 = *(long *)((long)pMVar13->first + 0x28);
      if (lVar5 == 3) {
        if (*(long *)((long)pMVar13->second + 0x28) != 3) goto switchD_0011288b_caseD_9;
        p->sort_score = C_THREE_C_THREE;
      }
      else {
        if ((lVar5 != 2) || (*(long *)((long)pMVar13->second + 0x28) != 2))
        goto switchD_0011288b_caseD_9;
        p->sort_score = C_TWO_C_TWO;
      }
      break;
    case 7:
      Atom::GetElement((Atom *)local_60);
      cVar3 = *(char *)(local_60._0_8_ + 0x42);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
      if (cVar3 == '\x06') {
        lVar5 = *(long *)((long)pMVar13->first + 0x28);
        if (lVar5 == 2) {
          if (*(long *)((long)pMVar13->second + 0x28) != 3) goto switchD_0011288b_caseD_9;
LAB_00112dc5:
          p->sort_score = C_THREE_N_TWO;
        }
        else {
          if ((lVar5 != 1) || (*(long *)((long)pMVar13->second + 0x28) != 2))
          goto switchD_0011288b_caseD_9;
LAB_00112d0e:
          p->sort_score = C_TWO_N_ONE;
        }
      }
      else if (cVar3 == '\a') {
        if ((*(long *)((long)pMVar13->first + 0x28) != 2) ||
           (*(long *)((long)pMVar13->second + 0x28) != 2)) goto switchD_0011288b_caseD_9;
        p->sort_score = N_TWO_N_TWO;
      }
      else {
        if (((cVar3 != '\b') || (*(long *)((long)pMVar13->first + 0x28) != 3)) ||
           (*(long *)((long)pMVar13->second + 0x28) != 1)) goto switchD_0011288b_caseD_9;
LAB_00112c83:
        p->sort_score = N_THREE_O_ONE;
      }
      break;
    case 8:
      Atom::GetElement((Atom *)local_60);
      cVar3 = *(char *)(local_60._0_8_ + 0x42);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
      if (cVar3 == '\x06') {
        if ((*(long *)((long)pMVar13->first + 0x28) == 1) &&
           (*(long *)((long)pMVar13->second + 0x28) == 3)) {
LAB_00112d3d:
          p->sort_score = C_THREE_O_ONE;
          break;
        }
      }
      else if (cVar3 == '\a') {
        if ((*(long *)((long)pMVar13->first + 0x28) == 1) &&
           (*(long *)((long)pMVar13->second + 0x28) == 3)) goto LAB_00112c83;
      }
      else if (cVar3 == '\x0f') {
        if ((*(long *)((long)pMVar13->first + 0x28) == 1) &&
           (*(long *)((long)pMVar13->second + 0x28) == 4)) goto LAB_00112cb2;
      }
      else if (((cVar3 == '\x10') && (*(long *)((long)pMVar13->first + 0x28) == 1)) &&
              (*(long *)((long)pMVar13->second + 0x28) == 4)) goto LAB_00112ad7;
    default:
switchD_0011288b_caseD_9:
LAB_00112def:
      p->sort_score = UNDEFINED;
      break;
    case 0xf:
      Atom::GetElement((Atom *)local_60);
      cVar3 = *(char *)(local_60._0_8_ + 0x42);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
      if ((cVar3 == '\b') &&
         ((*(long *)((long)pMVar13->first + 0x28) == 4 &&
          (*(long *)((long)pMVar13->second + 0x28) == 1)))) {
LAB_00112cb2:
        p->sort_score = O_ONE_P_FOUR;
        break;
      }
      goto switchD_0011288b_caseD_9;
    case 0x10:
      Atom::GetElement((Atom *)local_60);
      cVar3 = *(char *)(local_60._0_8_ + 0x42);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
      if (cVar3 == '\x06') {
        if ((*(long *)((long)pMVar13->first + 0x28) != 1) ||
           (*(long *)((long)pMVar13->second + 0x28) != 3)) goto switchD_0011288b_caseD_9;
LAB_00112bf4:
        p->sort_score = C_THREE_S_ONE;
      }
      else {
        if ((cVar3 != '\b') ||
           ((*(long *)((long)pMVar13->first + 0x28) != 4 ||
            (*(long *)((long)pMVar13->second + 0x28) != 1)))) goto switchD_0011288b_caseD_9;
LAB_00112ad7:
        p->sort_score = O_ONE_S_FOUR;
      }
    }
LAB_00112df6:
    std::vector<indigox::ElnVertProp_*,_std::allocator<indigox::ElnVertProp_*>_>::push_back
              (&sortedUniques,&p);
    pMVar13 = pMVar13 + 1;
  } while( true );
}

Assistant:

void ElectronOpt::SortPotentialLocations() {
  std::vector<ElnVertProp*> sortedUniques;
  sortedUniques.reserve(possibleLocations_.size());
  for (MolVertPair& vp : possibleLocations_) {
    ElnVertProp* p = elnGraph_->GetProperties(elnGraph_->GetVertex(vp));
    if (vp.first == vp.second) {
      MolVertProp* prop = molGraph_->GetProperties(vp.first);
      switch (prop->atom->GetElement()->GetAtomicNumber()) {
        case 7:  // Nitrogen
          switch (molGraph_->Degree(vp.first)) {
            case 1: p->sort_score = SortOrder::N_ONE; break;
            case 2: p->sort_score = SortOrder::N_TWO; break;
            case 3: p->sort_score = SortOrder::N_THREE; break;
            default: p->sort_score = SortOrder::UNDEFINED; break;
          }
          break;
        case 8:  // Oxygen
          switch (molGraph_->Degree(vp.first)) {
            case 1: p->sort_score = SortOrder::O_ONE; break;
            case 2: p->sort_score = SortOrder::O_TWO; break;
            default: p->sort_score = SortOrder::UNDEFINED; break;
          }
          break;
        case 9:  // Fluorine
          switch (molGraph_->Degree(vp.first)) {
            case 1: p->sort_score = SortOrder::F_ONE; break;
            default: p->sort_score = SortOrder::UNDEFINED; break;
          }
          break;
        case 15:  // Phosphorus
          switch (molGraph_->Degree(vp.first)) {
            case 1: p->sort_score = SortOrder::P_ONE; break;
            case 2: p->sort_score = SortOrder::P_TWO; break;
            case 3: p->sort_score = SortOrder::P_THREE; break;
            default: p->sort_score = SortOrder::UNDEFINED; break;
          }
          break;
        case 16:  // Sulfur
          switch (molGraph_->Degree(vp.first)) {
            case 1: p->sort_score = SortOrder::S_ONE; break;
            case 2: p->sort_score = SortOrder::S_ONE; break;
            default: p->sort_score = SortOrder::UNDEFINED; break;
          }
          break;
        case 17:  // Chlorine
          switch (molGraph_->Degree(vp.first)) {
            case 1: p->sort_score = SortOrder::CL_ONE; break;
            default: p->sort_score = SortOrder::UNDEFINED; break;
          }
          break;
        case 35:
          switch (molGraph_->Degree(vp.first)) {
            case 1: p->sort_score = SortOrder::BR_ONE; break;
            default: p->sort_score = SortOrder::UNDEFINED; break;
          }
          break;
        default: p->sort_score = SortOrder::UNDEFINED; break;
      }
    } else {
      MolVertProp* propa = molGraph_->GetProperties(vp.first);
      MolVertProp* propb = molGraph_->GetProperties(vp.second);
      switch (propa->atom->GetElement()->GetAtomicNumber()) {
        case 6:
          switch (propb->atom->GetElement()->GetAtomicNumber()) {
            case 6:
              if (molGraph_->Degree(vp.first) == 2
                  && molGraph_->Degree(vp.second) == 2)
                p->sort_score = SortOrder::C_TWO_C_TWO;
              else if (molGraph_->Degree(vp.first) == 3
                    && molGraph_->Degree(vp.second) == 3)
                  p->sort_score = SortOrder::C_THREE_C_THREE;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            case 7:
              if (molGraph_->Degree(vp.first) == 2
                  && molGraph_->Degree(vp.second) == 1)
                p->sort_score = SortOrder::C_TWO_N_ONE;
              else if (molGraph_->Degree(vp.first) == 3
                       && molGraph_->Degree(vp.second) == 2)
                p->sort_score = SortOrder::C_THREE_N_TWO;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            case 8:
              if (molGraph_->Degree(vp.first) == 3
                  && molGraph_->Degree(vp.second) == 1)
                p->sort_score = SortOrder::C_THREE_O_ONE;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            case 16:
              if (molGraph_->Degree(vp.first) == 3
                  && molGraph_->Degree(vp.second) == 1)
                p->sort_score = SortOrder::C_THREE_S_ONE;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            default: p->sort_score = SortOrder::UNDEFINED; break;
          }
          break;
        case 7:
          switch (propb->atom->GetElement()->GetAtomicNumber()) {
            case 6:
              if (molGraph_->Degree(vp.first) == 1
                  && molGraph_->Degree(vp.second) == 2)
                p->sort_score = SortOrder::C_TWO_N_ONE;
              else if (molGraph_->Degree(vp.first) == 2
                       && molGraph_->Degree(vp.second) == 3)
                p->sort_score = SortOrder::C_THREE_N_TWO;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            case 7:
              if (molGraph_->Degree(vp.first) == 2
                  && molGraph_->Degree(vp.second) == 2)
                p->sort_score = SortOrder::N_TWO_N_TWO;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            case 8:
              if (molGraph_->Degree(vp.first) == 3
                  && molGraph_->Degree(vp.second) == 1)
                p->sort_score = SortOrder::N_THREE_O_ONE;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            default: p->sort_score = SortOrder::UNDEFINED; break;
          }
          break;
        case 8:
          switch (propb->atom->GetElement()->GetAtomicNumber()) {
            case 6:
              if (molGraph_->Degree(vp.first) == 1
                  && molGraph_->Degree(vp.second) == 3)
                p->sort_score = SortOrder::C_THREE_O_ONE;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            case 7:
              if (molGraph_->Degree(vp.first) == 1
                  && molGraph_->Degree(vp.second) == 3)
                p->sort_score = SortOrder::N_THREE_O_ONE;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            case 15:
              if (molGraph_->Degree(vp.first) == 1
                  && molGraph_->Degree(vp.second) == 4)
                p->sort_score = SortOrder::O_ONE_P_FOUR;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            case 16:
              if (molGraph_->Degree(vp.first) == 1
                  && molGraph_->Degree(vp.second) == 4)
                p->sort_score = SortOrder::O_ONE_S_FOUR;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            default: p->sort_score = SortOrder::UNDEFINED; break;
          }
          break;
        case 15:
          switch (propb->atom->GetElement()->GetAtomicNumber()) {
            case 8:
              if (molGraph_->Degree(vp.first) == 4
                  && molGraph_->Degree(vp.second) == 1)
                p->sort_score = SortOrder::O_ONE_P_FOUR;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            default: p->sort_score = SortOrder::UNDEFINED; break;
          }
          break;
        case 16:
          switch (propb->atom->GetElement()->GetAtomicNumber()) {
            case 6:
              if (molGraph_->Degree(vp.first) == 1
                  && molGraph_->Degree(vp.second) == 3)
                p->sort_score = SortOrder::C_THREE_S_ONE;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            case 8:
              if (molGraph_->Degree(vp.first) == 4
                  && molGraph_->Degree(vp.second) == 1)
                p->sort_score = SortOrder::O_ONE_S_FOUR;
              else p->sort_score = SortOrder::UNDEFINED;
              break;
            default: p->sort_score = SortOrder::UNDEFINED; break;
          }
          break;
        default: p->sort_score = SortOrder::UNDEFINED; break;
      }
    }
    
    sortedUniques.push_back(p);
  }
  std::stable_sort(sortedUniques.begin(), sortedUniques.end(),
                   [](const ElnVertProp* lhs, const ElnVertProp* rhs) {
                     if (opt_::ALGORITHM == opt_::Algorithm::ASTAR)
                       return lhs->sort_score < rhs->sort_score;
                     else return lhs->sort_score > rhs->sort_score;
                   });
  
  for (unsigned int i = 0; i < sortedUniques.size(); ++i)
    possibleLocations_[i] = sortedUniques[i]->id;
}